

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O3

void blowfish_ssh_setkey(ssh_cipher *cipher,void *key)

{
  int iVar1;
  long lVar2;
  uint32_t *puVar3;
  ssh_cipher *psVar4;
  
  iVar1 = cipher->vt->padded_keybytes;
  puVar3 = parray;
  psVar4 = cipher + -10;
  for (lVar2 = 0x12; lVar2 != 0; lVar2 = lVar2 + -1) {
    *(uint32_t *)&psVar4->vt = *puVar3;
    puVar3 = puVar3 + 1;
    psVar4 = (ssh_cipher *)((long)&psVar4->vt + 4);
  }
  memcpy((BlowfishContext *)(cipher + -0x20a),sbox0,0x400);
  memcpy(cipher + -0x18a,sbox1,0x400);
  memcpy(cipher + -0x10a,sbox2,0x400);
  memcpy(cipher + -0x8a,sbox3,0x400);
  blowfish_expandkey((BlowfishContext *)(cipher + -0x20a),key,(short)iVar1,(void *)0x0,0);
  return;
}

Assistant:

static void blowfish_ssh_setkey(ssh_cipher *cipher, const void *key)
{
    struct blowfish_ctx *ctx = container_of(cipher, struct blowfish_ctx, ciph);
    blowfish_setkey(&ctx->context, key, ctx->ciph.vt->padded_keybytes);
}